

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O0

int iso9660AddEntry(PHYSFS_Io *io,int joliet,int isdir,char *base,PHYSFS_uint8 *fname,int fnamelen,
                   PHYSFS_sint64 ts,PHYSFS_uint64 pos,PHYSFS_uint64 len,void *unpkarc)

{
  undefined1 *ptr_00;
  PHYSFS_uint16 *src;
  size_t sVar1;
  PHYSFS_uint8 *pPVar2;
  PHYSFS_Io *io_00;
  PHYSFS_uint16 PVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  char *pcVar7;
  undefined1 **ppuVar8;
  undefined1 *local_88;
  char *local_80;
  char *ptr;
  PHYSFS_uint16 *pPStack_70;
  int total;
  PHYSFS_uint16 *ucs2;
  void *pvStack_60;
  int i;
  void *entry;
  size_t fullpathlen;
  size_t baselen;
  char *fnamecpy;
  char *fullpath;
  PHYSFS_uint16 *pPStack_30;
  int fnamelen_local;
  PHYSFS_uint8 *fname_local;
  char *base_local;
  int isdir_local;
  int joliet_local;
  PHYSFS_Io *io_local;
  
  ppuVar8 = &local_88;
  if ((fnamelen == 1) && ((*fname == '\0' || (*fname == '\x01')))) {
    io_local._4_4_ = 1;
  }
  else {
    fullpath._4_4_ = fnamelen;
    pPStack_30 = (PHYSFS_uint16 *)fname;
    fname_local = (PHYSFS_uint8 *)base;
    base_local._0_4_ = isdir;
    base_local._4_4_ = joliet;
    _isdir_local = io;
    if (fnamelen == 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
      io_local._4_4_ = 0;
    }
    else {
      if (fnamelen < 1) {
        __assert_fail("fnamelen > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_iso9660.c"
                      ,0x3f,
                      "int iso9660AddEntry(PHYSFS_Io *, const int, const int, const char *, PHYSFS_uint8 *, const int, const PHYSFS_sint64, const PHYSFS_uint64, const PHYSFS_uint64, void *)"
                     );
      }
      if (0xff < fnamelen) {
        __assert_fail("fnamelen <= 255",
                      "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_iso9660.c"
                      ,0x40,
                      "int iso9660AddEntry(PHYSFS_Io *, const int, const int, const char *, PHYSFS_uint8 *, const int, const PHYSFS_sint64, const PHYSFS_uint64, const PHYSFS_uint64, void *)"
                     );
      }
      if ((joliet == 0) || (fnamelen % 2 == 0)) {
        fullpathlen = strlen(base);
        iVar4 = 1;
        if (base_local._4_4_ != 0) {
          iVar4 = 2;
        }
        lVar5 = fullpathlen + (long)(fullpath._4_4_ * iVar4);
        pvVar6 = (void *)(lVar5 + 2);
        if (pvVar6 < (void *)0x100) {
          ppuVar8 = (undefined1 **)((long)&local_88 - (lVar5 + 0x19U & 0xfffffffffffffff0));
          local_88 = (undefined1 *)ppuVar8;
        }
        else {
          local_88 = (undefined1 *)0x0;
        }
        ptr_00 = local_88;
        entry = pvVar6;
        *(undefined8 *)((long)ppuVar8 + -8) = 0x1293ee;
        pcVar7 = (char *)__PHYSFS_initSmallAlloc(ptr_00,(size_t)pvVar6);
        pPVar2 = fname_local;
        pvVar6 = entry;
        fnamecpy = pcVar7;
        if (pcVar7 == (char *)0x0) {
          *(undefined8 *)((long)ppuVar8 + -8) = 0x129403;
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          io_local._4_4_ = 0;
        }
        else {
          baselen = (size_t)pcVar7;
          if (fullpathlen != 0) {
            *(undefined8 *)((long)ppuVar8 + -8) = 0x12943a;
            snprintf(pcVar7,(size_t)pvVar6,"%s/",pPVar2);
            baselen = fullpathlen + 1 + baselen;
            entry = (void *)((long)entry - (fullpathlen - 1));
          }
          sVar1 = baselen;
          if (base_local._4_4_ == 0) {
            for (ucs2._4_4_ = 0; ucs2._4_4_ < fullpath._4_4_; ucs2._4_4_ = ucs2._4_4_ + 1) {
              if (0x7f < *(byte *)((long)pPStack_30 + (long)ucs2._4_4_)) {
                *(undefined8 *)((long)ppuVar8 + -8) = 0x129503;
                PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                return 0;
              }
              *(PHYSFS_uint8 *)(baselen + (long)ucs2._4_4_) =
                   *(PHYSFS_uint8 *)((long)pPStack_30 + (long)ucs2._4_4_);
            }
            *(undefined1 *)(baselen + (long)fullpath._4_4_) = 0;
            if ((int)base_local == 0) {
              *(undefined8 *)((long)ppuVar8 + -8) = 0x129552;
              pcVar7 = strrchr((char *)sVar1,0x3b);
              if ((pcVar7 == (char *)0x0) || (pcVar7 == (char *)baselen)) {
                local_80 = (char *)(baselen + (long)(fullpath._4_4_ + -1));
              }
              else {
                local_80 = pcVar7 + -1;
                *pcVar7 = '\0';
              }
              if (*local_80 == '.') {
                *local_80 = '\0';
              }
            }
          }
          else {
            pPStack_70 = pPStack_30;
            ptr._4_4_ = fullpath._4_4_ / 2;
            for (ucs2._4_4_ = 0; sVar1 = baselen, pvVar6 = entry, src = pPStack_70,
                ucs2._4_4_ < ptr._4_4_; ucs2._4_4_ = ucs2._4_4_ + 1) {
              PVar3 = pPStack_70[ucs2._4_4_];
              *(undefined8 *)((long)ppuVar8 + -8) = 0x129499;
              PVar3 = PHYSFS_swapUBE16(PVar3);
              pPStack_70[ucs2._4_4_] = PVar3;
            }
            pPStack_70[ptr._4_4_] = 0;
            *(undefined8 *)((long)ppuVar8 + -8) = 0x1294d2;
            PHYSFS_utf8FromUcs2(src,(char *)sVar1,(PHYSFS_uint64)pvVar6);
          }
          iVar4 = (int)base_local;
          pcVar7 = fnamecpy;
          *(PHYSFS_uint64 *)((long)ppuVar8 + -0x10) = len;
          *(undefined8 *)((long)ppuVar8 + -0x18) = 0x1295ce;
          pvStack_60 = UNPK_addEntry(unpkarc,pcVar7,iVar4,ts,ts,pos,
                                     *(PHYSFS_uint64 *)((long)ppuVar8 + -0x10));
          io_00 = _isdir_local;
          iVar4 = base_local._4_4_;
          pcVar7 = fnamecpy;
          if ((pvStack_60 != (void *)0x0) && ((int)base_local != 0)) {
            *(undefined8 *)((long)ppuVar8 + -8) = 0x129603;
            iVar4 = iso9660LoadEntries(io_00,iVar4,pcVar7,pos,pos + len,unpkarc);
            if (iVar4 == 0) {
              pvStack_60 = (void *)0x0;
            }
          }
          pcVar7 = fnamecpy;
          *(undefined8 *)((long)ppuVar8 + -8) = 0x12961b;
          __PHYSFS_smallFree(pcVar7);
          io_local._4_4_ = (uint)(pvStack_60 != (void *)0x0);
        }
      }
      else {
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        io_local._4_4_ = 0;
      }
    }
  }
  return io_local._4_4_;
}

Assistant:

static int iso9660AddEntry(PHYSFS_Io *io, const int joliet, const int isdir,
                           const char *base, PHYSFS_uint8 *fname,
                           const int fnamelen, const PHYSFS_sint64 ts,
                           const PHYSFS_uint64 pos, const PHYSFS_uint64 len,
                           void *unpkarc)
{
    char *fullpath;
    char *fnamecpy;
    size_t baselen;
    size_t fullpathlen;
    void *entry;
    int i;

    if (fnamelen == 1 && ((fname[0] == 0) || (fname[0] == 1)))
        return 1;  /* Magic that represents "." and "..", ignore */

    BAIL_IF(fnamelen == 0, PHYSFS_ERR_CORRUPT, 0);
    assert(fnamelen > 0);
    assert(fnamelen <= 255);
    BAIL_IF(joliet && (fnamelen % 2), PHYSFS_ERR_CORRUPT, 0);

    /* Joliet is UCS-2, so at most UTF-8 will double the byte size */
    baselen = strlen(base);
    fullpathlen = baselen + (fnamelen * (joliet ? 2 : 1)) + 2;
    fullpath = (char *) __PHYSFS_smallAlloc(fullpathlen);
    BAIL_IF(!fullpath, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    fnamecpy = fullpath;
    if (baselen > 0)
    {
        snprintf(fullpath, fullpathlen, "%s/", base);
        fnamecpy += baselen + 1;
        fullpathlen -= baselen - 1;
    } /* if */

    if (joliet)
    {
        PHYSFS_uint16 *ucs2 = (PHYSFS_uint16 *) fname;
        int total = fnamelen / 2;
        for (i = 0; i < total; i++)
            ucs2[i] = PHYSFS_swapUBE16(ucs2[i]);
        ucs2[total] = '\0';
        PHYSFS_utf8FromUcs2(ucs2, fnamecpy, fullpathlen);
    } /* if */
    else
    {
        for (i = 0; i < fnamelen; i++)
        {
            /* We assume the filenames are low-ASCII; consider the archive
               corrupt if we see something above 127, since we don't know the
               encoding. (We can change this later if we find out these exist
               and are intended to be, say, latin-1 or UTF-8 encoding). */
            BAIL_IF(fname[i] > 127, PHYSFS_ERR_CORRUPT, 0);
            fnamecpy[i] = fname[i];
        } /* for */
        fnamecpy[fnamelen] = '\0';

        if (!isdir)
        {
            /* find last SEPARATOR2 */
            char *ptr = strrchr(fnamecpy, ';');
            if (ptr && (ptr != fnamecpy))
                *(ptr--) = '\0';
            else
                ptr = fnamecpy + (fnamelen - 1);

            /* chop out any trailing '.', as done in all implementations */
            if (*ptr == '.')
                *ptr = '\0';
        } /* if */
    } /* else */

    entry = UNPK_addEntry(unpkarc, fullpath, isdir, ts, ts, pos, len);
    if ((entry) && (isdir))
    {
        if (!iso9660LoadEntries(io, joliet, fullpath, pos, pos + len, unpkarc))
            entry = NULL;  /* so we report a failure later. */
    } /* if */

    __PHYSFS_smallFree(fullpath);
    return entry != NULL;
}